

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime_type.h
# Opt level: O2

void __thiscall
density::
runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>::
destroy(runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
        *this,void *i_dest)

{
  tuple_type *ptVar1;
  
  ptVar1 = this->m_feature_table;
  if (ptVar1 == (tuple_type *)0x0) {
    density_tests::detail::assert_failed<>
              ("!empty()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/runtime_type.h"
               ,0x3b0);
    ptVar1 = this->m_feature_table;
  }
  f_destroy::operator()
            (&(ptVar1->
              super__Tuple_impl<0UL,_density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
              ).super__Tuple_impl<1UL,_density::f_destroy,_density::f_size,_density::f_alignment>.
              super__Head_base<1UL,_density::f_destroy,_false>._M_head_impl,i_dest);
  return;
}

Assistant:

void destroy(void * i_dest) const noexcept
        {
            DENSITY_ASSERT(!empty());
            get_feature<f_destroy>()(i_dest);
        }